

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O1

IntrinsicResult intrinsic_getcwd(Context *context,IntrinsicResult partialResult)

{
  long *plVar1;
  size_t sVar2;
  anon_union_8_3_2f476f46_for_data aVar3;
  _func_int **__s;
  ulong __n;
  char buf [1024];
  Value local_438;
  char local_428 [1032];
  
  getcwd(local_428,0x400);
  sVar2 = strlen(local_428);
  if (sVar2 == 0) {
    aVar3.number = 0.0;
  }
  else {
    aVar3.ref = (RefCountedStorage *)operator_new(0x30);
    __n = sVar2 + 1;
    (aVar3.ref)->refCount = 1;
    (aVar3.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001d10b0;
    aVar3.ref[1].refCount = __n;
    aVar3.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
    __s = (_func_int **)operator_new__(__n);
    aVar3.ref[1]._vptr_RefCountedStorage = __s;
    memset(__s,0,__n);
    memcpy(__s,local_428,__n);
  }
  local_438.type = String;
  local_438.noInvoke = false;
  local_438.localOnly = Off;
  local_438.data = aVar3;
  if (aVar3.ref == (RefCountedStorage *)0x0) {
    local_438.data = DAT_001d3308;
  }
  if (local_438.data.ref != (RefCountedStorage *)0x0) {
    (local_438.data.ref)->refCount = (local_438.data.ref)->refCount + 1;
  }
  (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
  MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
  MiniScript::Value::operator=
            ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
             &local_438);
  *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
  if ((Temp < local_438.type) && (local_438.data.ref != (RefCountedStorage *)0x0)) {
    plVar1 = &(local_438.data.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_438.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_438.data.number = 0.0;
  }
  if (aVar3.ref != (RefCountedStorage *)0x0) {
    plVar1 = &(aVar3.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(aVar3.ref)->_vptr_RefCountedStorage[1])(aVar3.number);
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_getcwd(Context *context, IntrinsicResult partialResult) {
	char buf[1024];
	getcwd(buf, sizeof(buf));
	return IntrinsicResult(String(buf));
}